

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Type.cxx
# Opt level: O1

void __thiscall Fl_Type::~Fl_Type(Fl_Type *this)

{
  Fl_Type *pFVar1;
  Fl_Type **ppFVar2;
  
  this->_vptr_Fl_Type = (_func_int **)&PTR_setlabel_00272c30;
  if (widget_browser != (Widget_Browser *)0x0) {
    Fl_Browser_::deleting(&widget_browser->super_Fl_Browser_,this);
  }
  pFVar1 = this->prev;
  ppFVar2 = &first;
  if (pFVar1 != (Fl_Type *)0x0) {
    ppFVar2 = &pFVar1->next;
  }
  *ppFVar2 = this->next;
  ppFVar2 = &last;
  if (this->next != (Fl_Type *)0x0) {
    ppFVar2 = &this->next->prev;
  }
  *ppFVar2 = pFVar1;
  if (current == this) {
    current = (Fl_Type *)0x0;
  }
  pFVar1 = this->parent;
  if (pFVar1 != (Fl_Type *)0x0) {
    (*pFVar1->_vptr_Fl_Type[10])(pFVar1,this);
  }
  if (this->name_ != (char *)0x0) {
    free(this->name_);
  }
  if (this->label_ != (char *)0x0) {
    free(this->label_);
  }
  if (this->callback_ != (char *)0x0) {
    free(this->callback_);
  }
  if (this->user_data_ != (char *)0x0) {
    free(this->user_data_);
  }
  if (this->user_data_type_ != (char *)0x0) {
    free(this->user_data_type_);
  }
  if (this->comment_ != (char *)0x0) {
    free(this->comment_);
    return;
  }
  return;
}

Assistant:

Fl_Type::~Fl_Type() {
  // warning: destructor only works for widgets that have been add()ed.
  if (widget_browser) widget_browser->deleting(this);
  if (prev) prev->next = next; else first = next;
  if (next) next->prev = prev; else last = prev;
  if (current == this) current = 0;
  if (parent) parent->remove_child(this);
  if (name_) free((void*)name_);
  if (label_) free((void*)label_);
  if (callback_) free((void*)callback_);
  if (user_data_) free((void*)user_data_);
  if (user_data_type_) free((void*)user_data_type_);
  if (comment_) free((void*)comment_);
}